

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation_p.h
# Opt level: O3

void __thiscall QAbstractAnimationPrivate::emitCurrentLoopChanged(QAbstractAnimationPrivate *this)

{
  QObject *sender;
  long in_FS_OFFSET;
  parameter_type local_2c;
  void *local_28;
  parameter_type *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  local_2c = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
             ::value(&this->currentLoop);
  local_20 = &local_2c;
  local_28 = (void *)0x0;
  QMetaObject::activate(sender,&QAbstractAnimation::staticMetaObject,2,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_OBJECT_COMPAT_PROPERTY_WITH_ARGS(QAbstractAnimationPrivate, int, currentLoop, nullptr,
                                       &QAbstractAnimationPrivate::emitCurrentLoopChanged, 0)

    bool deleteWhenStopped = false;
    bool hasRegisteredTimer = false;
    bool isPause = false;
    bool isGroup = false;

    QAnimationGroup *group = nullptr;

private:
    Q_DECLARE_PUBLIC(QAbstractAnimation)
};


class QUnifiedTimer;
class QDefaultAnimationDriver : public QAnimationDriver
{
    Q_OBJECT
public:
    explicit QDefaultAnimationDriver(QUnifiedTimer *timer);
    ~QDefaultAnimationDriver() override;

protected:
    void timerEvent(QTimerEvent *e) override;

private Q_SLOTS:
    void startTimer();
    void stopTimer();

private:
    QBasicTimer m_timer;
    QUnifiedTimer *m_unified_timer;
};

class Q_CORE_EXPORT QAnimationDriverPrivate : public QObjectPrivate
{
public:
    QAnimationDriverPrivate();
    ~QAnimationDriverPrivate() override;

    QElapsedTimer timer;
    bool running = false;
}